

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_impl.h
# Opt level: O2

void secp256k1_hmac_sha256_finalize(secp256k1_hmac_sha256 *hash,uchar *out32)

{
  uchar temp [32];
  
  secp256k1_sha256_finalize(&hash->inner,temp);
  secp256k1_sha256_write(&hash->outer,temp,0x20);
  secp256k1_memclear(temp,0x20);
  secp256k1_sha256_finalize(&hash->outer,out32);
  return;
}

Assistant:

static void secp256k1_hmac_sha256_finalize(secp256k1_hmac_sha256 *hash, unsigned char *out32) {
    unsigned char temp[32];
    secp256k1_sha256_finalize(&hash->inner, temp);
    secp256k1_sha256_write(&hash->outer, temp, 32);
    secp256k1_memclear(temp, sizeof(temp));
    secp256k1_sha256_finalize(&hash->outer, out32);
}